

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlValidateOneNamespace
              (xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlChar *prefix,xmlNsPtr ns,
              xmlChar *value)

{
  int iVar1;
  xmlAttributeType xVar2;
  uint uVar3;
  xmlChar *pxVar4;
  xmlNotationPtr pxVar5;
  char *pcVar6;
  uint uVar7;
  xmlEnumerationPtr pxVar8;
  xmlChar *pxVar9;
  xmlChar *pxVar10;
  xmlAttributePtr local_70;
  xmlChar fn [50];
  
  if (doc == (xmlDocPtr)0x0) {
    return 0;
  }
  if (doc->intSubset == (_xmlDtd *)0x0) {
    if (elem == (xmlNodePtr)0x0) {
      return 0;
    }
    if (doc->extSubset == (_xmlDtd *)0x0) {
      return 0;
    }
  }
  else if (elem == (xmlNodePtr)0x0) {
    return 0;
  }
  if (ns == (xmlNsPtr)0x0 || elem->name == (xmlChar *)0x0) {
    return 0;
  }
  if (ns->href == (xmlChar *)0x0) {
    return 0;
  }
  if (prefix != (xmlChar *)0x0) {
    pxVar4 = xmlBuildQName(elem->name,prefix,fn,0x32);
    if (pxVar4 == (xmlChar *)0x0) {
      xmlVErrMemory(ctxt,"Validating namespace");
      return 0;
    }
    if (ns->prefix == (xmlChar *)0x0) {
      local_70 = xmlGetDtdAttrDesc(doc->intSubset,pxVar4,"xmlns");
      if (local_70 == (xmlAttributePtr)0x0) {
        if (doc->extSubset == (xmlDtdPtr)0x0) goto LAB_0018ccc9;
        local_70 = xmlGetDtdAttrDesc(doc->extSubset,pxVar4,"xmlns");
      }
    }
    else {
      local_70 = xmlGetDtdQAttrDesc(doc->intSubset,pxVar4,ns->prefix,"xmlns");
      if (local_70 == (xmlAttributePtr)0x0) {
        if (doc->extSubset == (xmlDtdPtr)0x0) {
LAB_0018ccc9:
          local_70 = (xmlAttributePtr)0x0;
        }
        else {
          local_70 = xmlGetDtdQAttrDesc(doc->extSubset,pxVar4,ns->prefix,"xmlns");
        }
      }
    }
    if ((pxVar4 != fn) && (pxVar4 != elem->name)) {
      (*xmlFree)(pxVar4);
    }
    if (local_70 != (xmlAttributePtr)0x0) goto LAB_0018cd5a;
  }
  if (ns->prefix == (xmlChar *)0x0) {
    local_70 = xmlGetDtdAttrDesc(doc->intSubset,elem->name,"xmlns");
    if (local_70 != (xmlAttributePtr)0x0) goto LAB_0018cd5a;
    if (doc->extSubset == (xmlDtdPtr)0x0) goto LAB_0018ce39;
    local_70 = xmlGetDtdAttrDesc(doc->extSubset,elem->name,"xmlns");
  }
  else {
    local_70 = xmlGetDtdQAttrDesc(doc->intSubset,elem->name,ns->prefix,"xmlns");
    if (local_70 != (xmlAttributePtr)0x0) goto LAB_0018cd5a;
    if (doc->extSubset == (xmlDtdPtr)0x0) goto LAB_0018ce39;
    local_70 = xmlGetDtdQAttrDesc(doc->extSubset,elem->name,ns->prefix,"xmlns");
  }
  if (local_70 == (xmlAttributePtr)0x0) {
LAB_0018ce39:
    if (ns->prefix == (xmlChar *)0x0) {
      pcVar6 = "No declaration for attribute xmlns of element %s\n";
      pxVar9 = (xmlChar *)0x0;
      pxVar4 = elem->name;
    }
    else {
      pcVar6 = "No declaration for attribute xmlns:%s of element %s\n";
      pxVar4 = ns->prefix;
      pxVar9 = elem->name;
    }
    xmlErrValidNode(ctxt,elem,XML_DTD_UNKNOWN_ATTRIBUTE,pcVar6,pxVar4,pxVar9,(xmlChar *)0x0);
    return 0;
  }
LAB_0018cd5a:
  iVar1 = xmlValidateAttributeValueInternal(doc,local_70->atype,value);
  if (iVar1 == 0) {
    if (ns->prefix == (xmlChar *)0x0) {
      uVar7 = 0;
      xmlErrValidNode(ctxt,elem,XML_DTD_INVALID_DEFAULT,
                      "Syntax of value for attribute xmlns of %s is not valid\n",elem->name,
                      (xmlChar *)0x0,(xmlChar *)0x0);
    }
    else {
      xmlErrValidNode(ctxt,elem,XML_DTD_INVALID_DEFAULT,
                      "Syntax of value for attribute xmlns:%s of %s is not valid\n",ns->prefix,
                      elem->name,(xmlChar *)0x0);
      uVar7 = 0;
    }
  }
  else {
    uVar7 = 1;
  }
  if ((local_70->def == XML_ATTRIBUTE_FIXED) &&
     (iVar1 = xmlStrEqual(value,local_70->defaultValue), iVar1 == 0)) {
    if (ns->prefix == (xmlChar *)0x0) {
      pxVar10 = (xmlChar *)0x0;
      pcVar6 = "Value for attribute xmlns of %s is different from default \"%s\"\n";
      pxVar4 = elem->name;
      pxVar9 = local_70->defaultValue;
    }
    else {
      pcVar6 = "Value for attribute xmlns:%s of %s is different from default \"%s\"\n";
      pxVar4 = ns->prefix;
      pxVar9 = elem->name;
      pxVar10 = local_70->defaultValue;
    }
    xmlErrValidNode(ctxt,elem,XML_DTD_ATTRIBUTE_DEFAULT,pcVar6,pxVar4,pxVar9,pxVar10);
    uVar7 = 0;
  }
  xVar2 = local_70->atype;
  if (xVar2 == XML_ATTRIBUTE_NOTATION) {
    pxVar8 = local_70->tree;
    pxVar5 = xmlGetDtdNotationDesc(doc->intSubset,value);
    if ((pxVar5 == (xmlNotationPtr)0x0) &&
       (pxVar5 = xmlGetDtdNotationDesc(doc->extSubset,value), pxVar5 == (xmlNotationPtr)0x0)) {
      if (ns->prefix == (xmlChar *)0x0) {
        pxVar9 = (xmlChar *)0x0;
        pcVar6 = "Value \"%s\" for attribute xmlns of %s is not a declared Notation\n";
        pxVar4 = elem->name;
      }
      else {
        pcVar6 = "Value \"%s\" for attribute xmlns:%s of %s is not a declared Notation\n";
        pxVar4 = ns->prefix;
        pxVar9 = elem->name;
      }
      xmlErrValidNode(ctxt,elem,XML_DTD_UNKNOWN_NOTATION,pcVar6,value,pxVar4,pxVar9);
      uVar7 = 0;
    }
    for (; pxVar8 != (xmlEnumerationPtr)0x0; pxVar8 = pxVar8->next) {
      iVar1 = xmlStrEqual(pxVar8->name,value);
      if (iVar1 != 0) goto LAB_0018cfb4;
    }
    if (ns->prefix == (xmlChar *)0x0) {
      pxVar9 = (xmlChar *)0x0;
      pcVar6 = "Value \"%s\" for attribute xmlns of %s is not among the enumerated notations\n";
      pxVar4 = elem->name;
    }
    else {
      pcVar6 = "Value \"%s\" for attribute xmlns:%s of %s is not among the enumerated notations\n";
      pxVar4 = ns->prefix;
      pxVar9 = elem->name;
    }
    xmlErrValidNode(ctxt,elem,XML_DTD_NOTATION_VALUE,pcVar6,value,pxVar4,pxVar9);
    uVar7 = 0;
LAB_0018cfb4:
    xVar2 = local_70->atype;
  }
  if (xVar2 == XML_ATTRIBUTE_ENUMERATION) {
    pxVar8 = (xmlEnumerationPtr)&local_70->tree;
    do {
      pxVar8 = pxVar8->next;
      if (pxVar8 == (xmlEnumerationPtr)0x0) {
        if (ns->prefix == (xmlChar *)0x0) {
          pxVar9 = (xmlChar *)0x0;
          pcVar6 = "Value \"%s\" for attribute xmlns of %s is not among the enumerated set\n";
          pxVar4 = elem->name;
        }
        else {
          pcVar6 = "Value \"%s\" for attribute xmlns:%s of %s is not among the enumerated set\n";
          pxVar4 = ns->prefix;
          pxVar9 = elem->name;
        }
        xmlErrValidNode(ctxt,elem,XML_DTD_ATTRIBUTE_VALUE,pcVar6,value,pxVar4,pxVar9);
        uVar7 = 0;
        break;
      }
      iVar1 = xmlStrEqual(pxVar8->name,value);
    } while (iVar1 == 0);
  }
  if ((local_70->def == XML_ATTRIBUTE_FIXED) &&
     (iVar1 = xmlStrEqual(local_70->defaultValue,value), iVar1 == 0)) {
    if (ns->prefix == (xmlChar *)0x0) {
      pxVar10 = (xmlChar *)0x0;
      pcVar6 = "Value for attribute xmlns of %s must be \"%s\"\n";
      pxVar4 = elem->name;
      pxVar9 = local_70->defaultValue;
    }
    else {
      pcVar6 = "Value for attribute xmlns:%s of %s must be \"%s\"\n";
      pxVar4 = ns->prefix;
      pxVar9 = elem->name;
      pxVar10 = local_70->defaultValue;
    }
    xmlErrValidNode(ctxt,elem,XML_DTD_ELEM_NAMESPACE,pcVar6,pxVar4,pxVar9,pxVar10);
    uVar7 = 0;
  }
  pxVar4 = "xmlns";
  if (ns->prefix != (xmlChar *)0x0) {
    pxVar4 = ns->prefix;
  }
  uVar3 = xmlValidateAttributeValue2(ctxt,doc,pxVar4,local_70->atype,value);
  return uVar3 & uVar7;
}

Assistant:

int
xmlValidateOneNamespace(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
xmlNodePtr elem, const xmlChar *prefix, xmlNsPtr ns, const xmlChar *value) {
    /* xmlElementPtr elemDecl; */
    xmlAttributePtr attrDecl =  NULL;
    int val;
    int ret = 1;

    CHECK_DTD;
    if ((elem == NULL) || (elem->name == NULL)) return(0);
    if ((ns == NULL) || (ns->href == NULL)) return(0);

    if (prefix != NULL) {
	xmlChar fn[50];
	xmlChar *fullname;

	fullname = xmlBuildQName(elem->name, prefix, fn, 50);
	if (fullname == NULL) {
	    xmlVErrMemory(ctxt, "Validating namespace");
	    return(0);
	}
	if (ns->prefix != NULL) {
	    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, fullname,
		                          ns->prefix, BAD_CAST "xmlns");
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, fullname,
					  ns->prefix, BAD_CAST "xmlns");
	} else {
	    attrDecl = xmlGetDtdAttrDesc(doc->intSubset, fullname,
		                         BAD_CAST "xmlns");
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdAttrDesc(doc->extSubset, fullname,
			                 BAD_CAST "xmlns");
	}
	if ((fullname != fn) && (fullname != elem->name))
	    xmlFree(fullname);
    }
    if (attrDecl == NULL) {
	if (ns->prefix != NULL) {
	    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, elem->name,
		                          ns->prefix, BAD_CAST "xmlns");
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, elem->name,
					      ns->prefix, BAD_CAST "xmlns");
	} else {
	    attrDecl = xmlGetDtdAttrDesc(doc->intSubset,
		                         elem->name, BAD_CAST "xmlns");
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdAttrDesc(doc->extSubset,
					     elem->name, BAD_CAST "xmlns");
	}
    }


    /* Validity Constraint: Attribute Value Type */
    if (attrDecl == NULL) {
	if (ns->prefix != NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_ATTRIBUTE,
		   "No declaration for attribute xmlns:%s of element %s\n",
		   ns->prefix, elem->name, NULL);
	} else {
	    xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_ATTRIBUTE,
		   "No declaration for attribute xmlns of element %s\n",
		   elem->name, NULL, NULL);
	}
	return(0);
    }

    val = xmlValidateAttributeValueInternal(doc, attrDecl->atype, value);
    if (val == 0) {
	if (ns->prefix != NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_INVALID_DEFAULT,
	       "Syntax of value for attribute xmlns:%s of %s is not valid\n",
		   ns->prefix, elem->name, NULL);
	} else {
	    xmlErrValidNode(ctxt, elem, XML_DTD_INVALID_DEFAULT,
	       "Syntax of value for attribute xmlns of %s is not valid\n",
		   elem->name, NULL, NULL);
	}
        ret = 0;
    }

    /* Validity constraint: Fixed Attribute Default */
    if (attrDecl->def == XML_ATTRIBUTE_FIXED) {
	if (!xmlStrEqual(value, attrDecl->defaultValue)) {
	    if (ns->prefix != NULL) {
		xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_DEFAULT,
       "Value for attribute xmlns:%s of %s is different from default \"%s\"\n",
		       ns->prefix, elem->name, attrDecl->defaultValue);
	    } else {
		xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_DEFAULT,
       "Value for attribute xmlns of %s is different from default \"%s\"\n",
		       elem->name, attrDecl->defaultValue, NULL);
	    }
	    ret = 0;
	}
    }

    /*
     * Casting ns to xmlAttrPtr is wrong. We'd need separate functions
     * xmlAddID and xmlAddRef for namespace declarations, but it makes
     * no practical sense to use ID types anyway.
     */
#if 0
    /* Validity Constraint: ID uniqueness */
    if (attrDecl->atype == XML_ATTRIBUTE_ID) {
        if (xmlAddID(ctxt, doc, value, (xmlAttrPtr) ns) == NULL)
	    ret = 0;
    }

    if ((attrDecl->atype == XML_ATTRIBUTE_IDREF) ||
	(attrDecl->atype == XML_ATTRIBUTE_IDREFS)) {
        if (xmlAddRef(ctxt, doc, value, (xmlAttrPtr) ns) == NULL)
	    ret = 0;
    }
#endif

    /* Validity Constraint: Notation Attributes */
    if (attrDecl->atype == XML_ATTRIBUTE_NOTATION) {
        xmlEnumerationPtr tree = attrDecl->tree;
        xmlNotationPtr nota;

        /* First check that the given NOTATION was declared */
	nota = xmlGetDtdNotationDesc(doc->intSubset, value);
	if (nota == NULL)
	    nota = xmlGetDtdNotationDesc(doc->extSubset, value);

	if (nota == NULL) {
	    if (ns->prefix != NULL) {
		xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_NOTATION,
       "Value \"%s\" for attribute xmlns:%s of %s is not a declared Notation\n",
		       value, ns->prefix, elem->name);
	    } else {
		xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_NOTATION,
       "Value \"%s\" for attribute xmlns of %s is not a declared Notation\n",
		       value, elem->name, NULL);
	    }
	    ret = 0;
        }

	/* Second, verify that it's among the list */
	while (tree != NULL) {
	    if (xmlStrEqual(tree->name, value)) break;
	    tree = tree->next;
	}
	if (tree == NULL) {
	    if (ns->prefix != NULL) {
		xmlErrValidNode(ctxt, elem, XML_DTD_NOTATION_VALUE,
"Value \"%s\" for attribute xmlns:%s of %s is not among the enumerated notations\n",
		       value, ns->prefix, elem->name);
	    } else {
		xmlErrValidNode(ctxt, elem, XML_DTD_NOTATION_VALUE,
"Value \"%s\" for attribute xmlns of %s is not among the enumerated notations\n",
		       value, elem->name, NULL);
	    }
	    ret = 0;
	}
    }

    /* Validity Constraint: Enumeration */
    if (attrDecl->atype == XML_ATTRIBUTE_ENUMERATION) {
        xmlEnumerationPtr tree = attrDecl->tree;
	while (tree != NULL) {
	    if (xmlStrEqual(tree->name, value)) break;
	    tree = tree->next;
	}
	if (tree == NULL) {
	    if (ns->prefix != NULL) {
		xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_VALUE,
"Value \"%s\" for attribute xmlns:%s of %s is not among the enumerated set\n",
		       value, ns->prefix, elem->name);
	    } else {
		xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_VALUE,
"Value \"%s\" for attribute xmlns of %s is not among the enumerated set\n",
		       value, elem->name, NULL);
	    }
	    ret = 0;
	}
    }

    /* Fixed Attribute Default */
    if ((attrDecl->def == XML_ATTRIBUTE_FIXED) &&
        (!xmlStrEqual(attrDecl->defaultValue, value))) {
	if (ns->prefix != NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_ELEM_NAMESPACE,
		   "Value for attribute xmlns:%s of %s must be \"%s\"\n",
		   ns->prefix, elem->name, attrDecl->defaultValue);
	} else {
	    xmlErrValidNode(ctxt, elem, XML_DTD_ELEM_NAMESPACE,
		   "Value for attribute xmlns of %s must be \"%s\"\n",
		   elem->name, attrDecl->defaultValue, NULL);
	}
        ret = 0;
    }

    /* Extra check for the attribute value */
    if (ns->prefix != NULL) {
	ret &= xmlValidateAttributeValue2(ctxt, doc, ns->prefix,
					  attrDecl->atype, value);
    } else {
	ret &= xmlValidateAttributeValue2(ctxt, doc, BAD_CAST "xmlns",
					  attrDecl->atype, value);
    }

    return(ret);
}